

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPolComponent_VectorImplementation.cpp
# Opt level: O1

void __thiscall
JPolComponent_VectorImplementation::ExportPolicyToFile
          (JPolComponent_VectorImplementation *this,string *path,Index *horizon)

{
  PolicyPureVector *pPVar1;
  char cVar2;
  uint uVar3;
  uint uVar4;
  ostream *poVar5;
  undefined4 extraout_var;
  long *plVar6;
  ulong uVar7;
  Interface_ProblemToPolicyDiscretePure *pIVar8;
  ulong uVar9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> numObvsHistory;
  ofstream fp;
  allocator_type local_251;
  ulong local_250;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_248;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream((ostream *)&local_230,(path->_M_dataplus)._M_p,_S_out);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"Horizon : ",10);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  pIVar8 = this->_m_PTPDP;
  if (pIVar8 == (Interface_ProblemToPolicyDiscretePure *)0x0) {
    pIVar8 = (this->_m_PTPDPshared).px;
  }
  uVar3 = (*(pIVar8->super_Interface_ProblemToPolicyDiscrete).
            _vptr_Interface_ProblemToPolicyDiscrete[3])();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"NrAgents : ",0xb);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_248,(ulong)uVar3,&local_251);
  if (uVar3 != 0) {
    uVar9 = 0;
    local_250 = CONCAT44(extraout_var,uVar3);
    do {
      pIVar8 = this->_m_PTPDP;
      if (pIVar8 == (Interface_ProblemToPolicyDiscretePure *)0x0) {
        pIVar8 = (this->_m_PTPDPshared).px;
      }
      uVar4 = (*(pIVar8->super_Interface_ProblemToPolicyDiscrete).
                _vptr_Interface_ProblemToPolicyDiscrete[5])
                        (pIVar8,uVar9 & 0xffffffff,1,
                         *(undefined8 *)
                          &(this->_m_indivPols_PolicyPureVector).
                           super__Vector_base<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar9]->field_0x8);
      local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar9] = uVar4;
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," : ",3);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      uVar9 = uVar9 + 1;
    } while (uVar3 != uVar9);
    local_250 = local_250 & 0xffffffff;
    uVar9 = 0;
    do {
      cVar2 = (char)&local_230;
      std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar2);
      std::ostream::put(cVar2);
      plVar6 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
      std::ostream::put((char)plVar6);
      std::ostream::flush();
      pPVar1 = (this->_m_indivPols_PolicyPureVector).
               super__Vector_base<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar9];
      (**(code **)(*(long *)pPVar1 + 0x40))(pPVar1,0);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      if (1 < local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar9]) {
        uVar7 = 1;
        do {
          if ((int)(uVar7 / 0x1e) * -0x1f + (int)(uVar7 / 0x1e) + (int)uVar7 == 0) {
            std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar2);
            std::ostream::put(cVar2);
            std::ostream::flush();
          }
          pPVar1 = (this->_m_indivPols_PolicyPureVector).
                   super__Vector_base<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar9];
          (**(code **)(*(long *)pPVar1 + 0x40))(pPVar1,uVar7);
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
          uVar3 = (int)uVar7 + 1;
          uVar7 = (ulong)uVar3;
        } while (uVar3 < local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar9]);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != local_250);
  }
  if (local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __M_insert<void_const*>;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void JPolComponent_VectorImplementation::ExportPolicyToFile(const std::string& path, const Index& horizon) const {
    ofstream fp(path.c_str());

    // Output horizon
    fp << "Horizon : " << horizon << endl;

    // Get nr agents and output to file
    Index nrAgents = GetInterfacePTPDiscretePure()->GetNrAgents();
    fp << "NrAgents : " << nrAgents << endl;


    vector<Index> numObvsHistory(nrAgents);

    // Get number of observation histories for each agent
    for(Index i=0; i<nrAgents; ++i) {

        numObvsHistory[i] = GetInterfacePTPDiscretePure()->GetNrPolicyDomainElements(
            i, PolicyGlobals::OHIST_INDEX, _m_indivPols_PolicyPureVector[i]->GetDepth());

        fp << i << " : " << numObvsHistory[i] << endl;
    }

    // Output policies for all agents
    for(Index i=0; i<nrAgents; ++i) {

        // Output policy
        fp << endl << endl;

        // Output first action
        fp << _m_indivPols_PolicyPureVector[i]->GetActionIndex(0) << " ";

        // Output rest
        for(Index j=1; j<numObvsHistory[i]; ++j) {

            // Break lines
            if(j % 30 == 0) {
                fp << endl;
            }

            fp << _m_indivPols_PolicyPureVector[i]->GetActionIndex(j) << " ";
        }
    }
}